

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlat<long,long,long,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperator,bool,true,false>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  long *ldata;
  unsigned_long *puVar1;
  long *rdata;
  long *result_data;
  
  ldata = (long *)left->data;
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  rdata = (long *)right->data;
  if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
    return;
  }
  Vector::SetVectorType(result,FLAT_VECTOR);
  result_data = (long *)result->data;
  FlatVector::VerifyFlatVector(result);
  FlatVector::VerifyFlatVector(right);
  FlatVector::SetValidity(result,&right->validity);
  ExecuteFlatLoop<long,long,long,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperator,bool,true,false>
            (ldata,rdata,result_data,count,&result->validity,fun);
  return;
}

Assistant:

static void ExecuteFlat(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if ((LEFT_CONSTANT && ConstantVector::IsNull(left)) || (RIGHT_CONSTANT && ConstantVector::IsNull(right))) {
			// either left or right is constant NULL: result is constant NULL
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		auto &result_validity = FlatVector::Validity(result);
		if (LEFT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(right), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(right));
			}
		} else if (RIGHT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
			}
		} else {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
				if (result_validity.AllValid()) {
					result_validity.Copy(FlatVector::Validity(right), count);
				} else {
					result_validity.Combine(FlatVector::Validity(right), count);
				}
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
				result_validity.Combine(FlatVector::Validity(right), count);
			}
		}
		ExecuteFlatLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, result_data, count, result_validity, fun);
	}